

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O0

void __thiscall Sexp::Finalize(Sexp *this)

{
  Activation *this_00;
  function<Sexp_*(Sexp_**)> *this_01;
  bool bVar1;
  Sexp *this_local;
  
  bVar1 = IsString(this);
  if (bVar1) {
    free((this->field_1).cons.car);
  }
  else {
    bVar1 = IsActivation(this);
    if (bVar1) {
      this_00 = (this->field_1).activation;
      if (this_00 != (Activation *)0x0) {
        Activation::~Activation(this_00);
        operator_delete(this_00,0x20);
      }
    }
    else {
      bVar1 = IsNativeFunction(this);
      if (bVar1) {
        this_01 = (this->field_1).native_function.func;
        if (this_01 != (function<Sexp_*(Sexp_**)> *)0x0) {
          std::function<Sexp_*(Sexp_**)>::~function(this_01);
          operator_delete(this_01,0x20);
        }
      }
      else {
        bVar1 = IsFunction(this);
        if ((!bVar1) && (bVar1 = IsMeaning(this), !bVar1)) {
          PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
                    ,0x3c,"Finalize","finalized something that\'s not finalizable!");
        }
      }
    }
  }
  return;
}

Assistant:

void Sexp::Finalize() {
  if (IsString()) {
    free(const_cast<char *>(this->string_value));
    return;
  }

  if (IsActivation()) {
    delete this->activation;
    return;
  }

  if (IsNativeFunction()) {
    delete this->native_function.func;
    return;
  }

  if (IsFunction()) {
    // TODO this also screws up everything.
    // delete this->function.func_meaning;
    return;
  }

  if (IsMeaning()) {
    // TODO this screws up everything.
    // I'm choosing to leak meanings for now
    // until I figure out how to address this correctly.
    // delete this->meaning;

    return;
  }

  PANIC("finalized something that's not finalizable!");
}